

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O3

void test_qlist_insert(void)

{
  undefined4 *puVar1;
  long ****pppplVar2;
  int iVar3;
  uint cond;
  long ***local_50;
  long ***local_48;
  undefined4 local_40;
  long **local_38;
  
  local_50 = (long ***)&local_50;
  local_48 = (long ***)&local_50;
  puVar1 = (undefined4 *)malloc(0x10);
  acutest_check_((uint)(puVar1 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x112,"%s","d != NULL");
  *puVar1 = 5;
  *(long ****)(puVar1 + 2) = local_50;
  local_50 = (long ***)(puVar1 + 2);
  if ((long ****)local_48 == &local_50) {
    local_48 = local_50;
  }
  puVar1 = (undefined4 *)malloc(0x10);
  acutest_check_((uint)(puVar1 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x112,"%s","d != NULL");
  *puVar1 = 3;
  *(long ****)(puVar1 + 2) = local_50;
  pppplVar2 = (long ****)(puVar1 + 2);
  if ((long ****)local_48 == &local_50) {
    local_48 = (long ***)pppplVar2;
  }
  local_50 = (long ***)pppplVar2;
  puVar1 = (undefined4 *)malloc(0x10);
  acutest_check_((uint)(puVar1 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x112,"%s","d != NULL");
  *puVar1 = 4;
  *(long ****)(puVar1 + 2) = *pppplVar2;
  *pppplVar2 = (long ***)(puVar1 + 2);
  if ((long ****)local_48 == pppplVar2) {
    local_48 = (long ***)(puVar1 + 2);
  }
  puVar1 = (undefined4 *)malloc(0x10);
  acutest_check_((uint)(puVar1 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x112,"%s","d != NULL");
  *puVar1 = 1;
  *(long ****)(puVar1 + 2) = local_50;
  pppplVar2 = (long ****)(puVar1 + 2);
  if ((long ****)local_48 == &local_50) {
    local_48 = (long ***)pppplVar2;
  }
  local_50 = (long ***)pppplVar2;
  puVar1 = (undefined4 *)malloc(0x10);
  acutest_check_((uint)(puVar1 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x112,"%s","d != NULL");
  *puVar1 = 2;
  *(long ****)(puVar1 + 2) = *pppplVar2;
  *pppplVar2 = (long ***)(puVar1 + 2);
  if ((long ****)local_48 == pppplVar2) {
    local_48 = (long ***)(puVar1 + 2);
  }
  puVar1 = (undefined4 *)malloc(0x10);
  acutest_check_((uint)(puVar1 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x112,"%s","d != NULL");
  *puVar1 = 6;
  *(long *****)(puVar1 + 2) = &local_50;
  pppplVar2 = (long ****)(puVar1 + 2);
  *local_48 = (long **)pppplVar2;
  local_40 = 0x29a;
  local_38 = *local_50;
  *local_50 = (long **)&local_38;
  *local_50 = local_38;
  local_48 = (long ***)pppplVar2;
  if (pppplVar2 == (long ****)local_50) {
    local_48 = local_50;
  }
  if ((long ****)local_50 != &local_50) {
    iVar3 = 1;
    pppplVar2 = (long ****)local_50;
    do {
      acutest_check_((uint)(iVar3 == *(int *)(pppplVar2 + -1)),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                     ,0x160,"%s","data->value == n");
      iVar3 = iVar3 + 1;
      pppplVar2 = (long ****)*pppplVar2;
    } while (pppplVar2 != &local_50);
  }
  if ((long ****)local_50 == &local_50) {
    cond = 0;
  }
  else {
    iVar3 = 6;
    do {
      if (local_48 == local_50) {
        local_48 = (long ***)&local_50;
      }
      pppplVar2 = (long ****)local_50 + -1;
      local_50 = (long ***)*local_50;
      free(pppplVar2);
      iVar3 = iVar3 + -1;
    } while ((long ****)local_50 != &local_50);
    cond = (uint)(iVar3 == 0);
  }
  acutest_check_(cond,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x16b,"%s","n == 6");
  return;
}

Assistant:

static void
test_qlist_insert(void)
{
    QLIST list;
    QLIST_NODE* node;
    QDATA* data;
    QDATA xxx;
    int n;

    /* Create simple list. */
    qlist_init(&list);
    qlist_prepend(&list, &alloc_qdata(5)->list_node);                           /* 5 */
    qlist_prepend(&list, &alloc_qdata(3)->list_node);                           /* 3 -> 5 */
    qlist_insert_after(&list, qlist_head(&list), &alloc_qdata(4)->list_node);   /* 3 -> 4 -> 5 */
    qlist_prepend(&list, &alloc_qdata(1)->list_node);                           /* 1 -> 3 -> 4 -> 5 */
    qlist_insert_after(&list, qlist_head(&list), &alloc_qdata(2)->list_node);   /* 1 -> 2 -> 3 -> 4 -> 5 */
    qlist_append(&list, &alloc_qdata(6)->list_node);                            /* 1 -> 2 -> 3 -> 4 -> 5 -> 6 */

    /* Verify that removals do not break integrity. */
    xxx.value = 666;
    qlist_prepend(&list, &xxx.list_node);
    qlist_remove_head(&list);
    qlist_insert_after(&list, qlist_head(&list), &xxx.list_node);
    qlist_remove(&list, qlist_head(&list), &xxx.list_node);

    /* Iterate forward. */
    for(node = qlist_head(&list), n = 1; node != qlist_end(&list); node = qlist_next(node), n++) {
        data = QLIST_DATA(node, QDATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!qlist_is_empty(&list)) {
        node = qlist_head(&list);
        qlist_remove_head(&list);
        free(QLIST_DATA(node, QDATA, list_node));
        n++;
    }
    TEST_CHECK(n == 6);
}